

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_bot.cpp
# Opt level: O0

void Cmd_listbots(FCommandLine *argv,APlayerPawn *who,int key)

{
  char *pcVar1;
  uint local_2c;
  botinfo_t *pbStack_28;
  int count;
  botinfo_t *thebot;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  local_2c = 0;
  for (pbStack_28 = bglobal.botinfo; pbStack_28 != (botinfo_t *)0x0; pbStack_28 = pbStack_28->next)
  {
    pcVar1 = "";
    if (pbStack_28->inuse == 2) {
      pcVar1 = " (active)";
    }
    Printf("%s%s\n",pbStack_28->name,pcVar1);
    local_2c = local_2c + 1;
  }
  Printf("> %d bots\n",(ulong)local_2c);
  return;
}

Assistant:

CCMD (listbots)
{
	botinfo_t *thebot = bglobal.botinfo;
	int count = 0;

	while (thebot)
	{
		Printf ("%s%s\n", thebot->name, thebot->inuse == BOTINUSE_Yes ? " (active)" : "");
		thebot = thebot->next;
		count++;
	}
	Printf ("> %d bots\n", count);
}